

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  int iVar1;
  runtime_error *prVar2;
  Profile profile;
  SessionB sessionB;
  Profile copy;
  SessionB sessionBAlias;
  Session session;
  Id id;
  Session sessionAlias;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  char *local_78;
  _Any_data local_70;
  code *local_60;
  undefined1 local_50 [4];
  undefined1 local_4c [4];
  undefined1 local_48 [16];
  _Manager_type local_38;
  _Invoker_type local_30;
  undefined8 uStack_28;
  
  local_78 = local_70._M_pod_data + 8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"Alice","");
  iVar1 = (*_Init)(&local_98,local_78,0xb);
  if (iVar1 != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Failed in ctor");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_78 != local_70._M_pod_data + 8) {
    operator_delete(local_78,local_70._8_8_ + 1);
  }
  iVar1 = Profile_print(local_98);
  if (iVar1 == 0) {
    iVar1 = Profile_setAge(local_98,0xc);
    if (iVar1 == 0) {
      iVar1 = Profile_copy(local_98,&local_88);
      if (iVar1 != 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failed in copy ctor");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = Profile_print(local_88);
      if (iVar1 != 0) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failed printing");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = Id_create(local_50,local_4c);
      if (iVar1 == 0) {
        iVar1 = Id_applyLogic(local_50,local_4c);
        if (iVar1 == 0) {
          local_48._0_8_ = (void *)0x0;
          local_48._8_8_ = 0;
          local_30 = std::
                     _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/app/main.cpp:22:13)>
                     ::_M_invoke;
          local_38 = std::
                     _Function_handler<void_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/app/main.cpp:22:13)>
                     ::_M_manager;
          std::function<void_(int)>::function
                    ((function<void_(int)> *)&local_70,(function<void_(int)> *)local_48);
          iVar1 = Session_create_f(&local_78,sessionDispatch,&local_70);
          if (iVar1 != 0) {
            prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar2,"Failed in cb ctor");
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          if (local_38 != (_Manager_type)0x0) {
            (*local_38)((_Any_data *)local_48,(_Any_data *)local_48,__destroy_functor);
          }
          local_30 = (_Invoker_type)0x0;
          uStack_28 = 0;
          local_48._8_8_ = 0;
          local_38 = (_Manager_type)0x0;
          iVar1 = Session_copy(local_78,local_48);
          if (iVar1 != 0) {
            prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar2,"Failed in copy ctor");
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          Session_print(local_78,HG::streamOut<std::ostream>,&std::cout);
          iVar1 = Session_call(local_48._0_8_);
          if (iVar1 != 0) {
            prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar2,"Failed calling");
            __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          iVar1 = SessionB_create(&local_90);
          if (iVar1 == 0) {
            iVar1 = SessionB_copy(local_90,&local_80);
            if (iVar1 != 0) {
              prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar2,"Failed in copy ctor");
              __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"======\n",7);
            iVar1 = SessionB_destroy(local_80);
            if (iVar1 == 0) {
              iVar1 = SessionB_destroy(local_90);
              if (iVar1 == 0) {
                iVar1 = Session_destroy(local_48._0_8_);
                if (iVar1 == 0) {
                  if (local_30 != (_Invoker_type)0x0) {
                    (*local_30)((_Any_data *)(local_48 + 8),(int *)(local_48 + 8));
                  }
                  iVar1 = Session_destroy(local_78);
                  if (iVar1 == 0) {
                    if (local_60 != (code *)0x0) {
                      (*local_60)(&local_70,&local_70,__destroy_functor);
                    }
                    iVar1 = Profile_destroy(local_88);
                    if (iVar1 == 0) {
                      iVar1 = Profile_destroy(local_98);
                      if (iVar1 == 0) {
                        return 0;
                      }
                    }
                    __assert_fail("0 == rc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/library/include/profile.h"
                                  ,0x35,"HG::Profile::~Profile()");
                  }
                }
                __assert_fail("0 == Session_destroy(handle)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/library/include/session.h"
                              ,0x49,"HG::Session::~Session()");
              }
            }
            __assert_fail("0 == SessionB_destroy(handle)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nsergey82[P]hourglass/library/include/session_b.h"
                          ,0x30,"HG::SessionB::~SessionB()");
          }
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar2,"Failed in ctor");
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failed in applyLogic");
      }
      else {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"Failed in ctor");
      }
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Failed setting age");
  }
  else {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Failed printing");
  }
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main(int, char**) {
    HG::Profile profile("Alice", 11);
    profile.print();
    profile.setAge(12);
    HG::Profile copy(profile);
    copy.print();


    HG::Id id;
    id.applyLogic();

    // this is your std::function<void (int)>
    auto cb =
            [](int a){ std::cout << "Library gave " << a << " to callback\n"; };

    HG::Session session(cb);
    HG::Session sessionAlias(session);
    session.print(std::cout);
    sessionAlias.call();

    // `sessionAlias.call()` conceptually the same as:
    //Session_cb_t *cbptr = reinterpret_cast<Session_cb_t*>(&cb);
    //SessionHandlerCallerPtr  caller = &dispatchAny<decltype(cb), Session_cb_t>;
    //caller(cbptr, 42);

    HG::SessionB sessionB;
    HG::SessionB sessionBAlias(sessionB);

    std::cout << "======\n";

}